

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiKeyChord ImGui::FixupKeyChord(ImGuiKeyChord key_chord)

{
  uint uVar1;
  
  if ((key_chord & ~ImGuiMod_Mask_) - ImGuiKey_LeftCtrl < 8) {
    uVar1 = GetModForModKey(key_chord & ~ImGuiMod_Mask_);
    key_chord = key_chord | uVar1;
  }
  return key_chord;
}

Assistant:

ImGuiKeyChord ImGui::FixupKeyChord(ImGuiKeyChord key_chord)
{
    // Add ImGuiMod_XXXX when a corresponding ImGuiKey_LeftXXX/ImGuiKey_RightXXX is specified.
    ImGuiKey key = (ImGuiKey)(key_chord & ~ImGuiMod_Mask_);
    if (IsModKey(key))
        key_chord |= GetModForModKey(key);
    return key_chord;
}